

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

void __thiscall
VGMPlayer::RefreshMuting(VGMPlayer *this,CHIP_DEVICE *chipDev,PLR_MUTE_OPTS *muteOpts)

{
  DEV_DATA *pDVar1;
  DEVFUNC_OPTMASK p_Var2;
  DEV_INFO *devInf;
  UINT8 linkCntr;
  ulong uVar3;
  
  for (uVar3 = 0; (chipDev != (CHIP_DEVICE *)0x0 && (uVar3 < 2)); uVar3 = uVar3 + 1) {
    pDVar1 = (chipDev->base).defInf.dataPtr;
    if ((pDVar1 != (DEV_DATA *)0x0) &&
       (p_Var2 = ((chipDev->base).defInf.devDef)->SetMuteMask, p_Var2 != (DEVFUNC_OPTMASK)0x0)) {
      (*p_Var2)(pDVar1,muteOpts->chnMute[uVar3]);
    }
    chipDev = (CHIP_DEVICE *)(chipDev->base).linkDev;
  }
  return;
}

Assistant:

void VGMPlayer::RefreshMuting(VGMPlayer::CHIP_DEVICE& chipDev, const PLR_MUTE_OPTS& muteOpts)
{
	VGM_BASEDEV* clDev;
	UINT8 linkCntr = 0;
	
	for (clDev = &chipDev.base; clDev != NULL && linkCntr < 2; clDev = clDev->linkDev, linkCntr ++)
	{
		DEV_INFO* devInf = &clDev->defInf;
		if (devInf->dataPtr != NULL && devInf->devDef->SetMuteMask != NULL)
			devInf->devDef->SetMuteMask(devInf->dataPtr, muteOpts.chnMute[linkCntr]);
	}
	
	return;
}